

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.cpp
# Opt level: O3

void __thiscall Emulator::update_screen(Emulator *this)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  ulong uVar8;
  uint32_t pixels [2048];
  ulong local_2008 [1024];
  long lVar3;
  
  if (this->should_draw == true) {
    uVar1 = 0;
    auVar2 = _DAT_00104030;
    do {
      auVar4 = auVar2 & _DAT_00104040;
      uVar7 = (this->framebuf).super__Base_bitset<32UL>._M_w[uVar1 >> 6];
      auVar6._8_4_ = (int)uVar7;
      auVar6._0_8_ = uVar7;
      auVar6._12_4_ = (int)(uVar7 >> 0x20);
      auVar5._8_4_ = auVar4._8_4_;
      auVar5._12_4_ = auVar4._12_4_;
      auVar5._0_8_ = auVar4._8_8_;
      uVar7 = 1L << auVar4._0_8_ & uVar7;
      uVar8 = 1L << auVar5._8_8_ & auVar6._8_8_;
      uVar7 = CONCAT44(-(uint)((int)uVar8 == 0),-(uint)((int)uVar7 == 0)) &
              CONCAT44(-(uint)((int)(uVar8 >> 0x20) == 0),-(uint)((int)(uVar7 >> 0x20) == 0));
      *(ulong *)((long)local_2008 + uVar1 * 4) =
           uVar7 & 0xff000000ff000000 | uVar7 ^ 0xffffffffffffffff;
      uVar1 = uVar1 + 2;
      lVar3 = auVar2._8_8_;
      auVar2._0_8_ = auVar2._0_8_ + 2;
      auVar2._8_8_ = lVar3 + 2;
    } while (uVar1 != 0x800);
    SDL_UpdateTexture((this->sdl).texture,0,local_2008,0x100);
    SDL_RenderCopy((this->sdl).renderer,(this->sdl).texture,0,0);
    SDL_RenderPresent((this->sdl).renderer);
    this->should_draw = false;
  }
  return;
}

Assistant:

void Emulator::update_screen(){
	// Update screen only when needed
	if (!should_draw)
		return;

	// Get the pixels from the framebuf
	uint32_t pixels[FRAMEBUF_H*FRAMEBUF_W];
	for (int i = 0; i < FRAMEBUF_H*FRAMEBUF_W; i++)
		pixels[i] = (framebuf[i] ? 0xFFFFFFFF : 0xFF000000);
	
	// Draw pixels
	SDL_UpdateTexture(sdl.texture, NULL, pixels, FRAMEBUF_W*sizeof(uint32_t));
	//SDL_RenderClear(sdl.renderer);
	SDL_RenderCopy(sdl.renderer, sdl.texture, NULL, NULL);
	SDL_RenderPresent(sdl.renderer);
	
	// Update flag
	should_draw = false;
}